

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_19cf73a::AV1ResizeXTest_DISABLED_SpeedTest_Test::
~AV1ResizeXTest_DISABLED_SpeedTest_Test(AV1ResizeXTest_DISABLED_SpeedTest_Test *this)

{
  AV1ResizeXTest::~AV1ResizeXTest(&this->super_AV1ResizeXTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(AV1ResizeXTest, DISABLED_SpeedTest) { SpeedTest(); }